

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.h
# Opt level: O2

Factor * __thiscall libDAI::NDP::GetFactor(NDP *this,size_t i)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_reference pvVar2;
  
  iVar1 = (*(this->_g->super_GraphicalModel)._vptr_GraphicalModel[9])();
  if (i < CONCAT44(extraout_var,iVar1)) {
    iVar1 = (*(this->_g->super_GraphicalModel)._vptr_GraphicalModel[10])(this->_g,i);
    return (Factor *)CONCAT44(extraout_var_00,iVar1);
  }
  pvVar2 = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::at
                     (&this->_m_newFacs,i - CONCAT44(extraout_var,iVar1));
  return pvVar2;
}

Assistant:

const Factor & GetFactor(size_t i) const
            {
                //nr of Original Factors:
                size_t nrOFs = _g->nrFactors();
                if(i < nrOFs)
                    return (_g->factor(i));
                else
                    return ( _m_newFacs.at(i - nrOFs) );
            }